

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhiwidget.cpp
# Opt level: O0

void __thiscall QRhiWidget::setFixedColorBufferSize(QRhiWidget *this,QSize pixelSize)

{
  long lVar1;
  bool bVar2;
  QRhiWidgetPrivate *lhs;
  QSize in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QRhiWidgetPrivate *d;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lhs = d_func((QRhiWidget *)0x349dee);
  bVar2 = ::operator!=((QSize *)lhs,(QSize *)in_RDI);
  if (bVar2) {
    lhs->fixedSize = in_RSI;
    fixedColorBufferSizeChanged((QRhiWidget *)lhs,(QSize *)in_RDI);
    QWidget::update(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRhiWidget::setFixedColorBufferSize(QSize pixelSize)
{
    Q_D(QRhiWidget);
    if (d->fixedSize != pixelSize) {
        d->fixedSize = pixelSize;
        emit fixedColorBufferSizeChanged(pixelSize);
        update();
    }
}